

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  float *pfVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ushort uVar10;
  ushort uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  byte bVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  int iVar28;
  undefined4 uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  size_t sVar38;
  ulong uVar39;
  ulong uVar40;
  NodeRef *pNVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  byte bVar48;
  float fVar49;
  float fVar50;
  byte bVar69;
  byte bVar70;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar51 [16];
  byte bVar71;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar75;
  float fVar94;
  float fVar97;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar76;
  float fVar77;
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar114;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  undefined1 auVar121 [16];
  float fVar125;
  float fVar132;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar146;
  float fVar147;
  undefined1 auVar141 [16];
  float fVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [12];
  undefined1 auVar154 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar179;
  undefined1 auVar177 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar192;
  float fVar193;
  undefined1 auVar184 [16];
  float fVar188;
  float fVar191;
  float fVar194;
  undefined1 auVar185 [16];
  UVIdentity<4> mapUV;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float old_t_1;
  float old_t;
  uint uStack_cb4;
  undefined8 uStack_cb0;
  float fStack_ca4;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  undefined4 uStack_c7c;
  undefined1 local_c68 [16];
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined1 (*local_c40) [12];
  long local_c38;
  long local_c30;
  RTCFilterFunctionNArguments args;
  float fStack_be0;
  float fStack_bdc;
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined1 local_9c8 [16];
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_9a8;
  undefined4 uStack_9a4;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined1 local_998 [16];
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  uint local_968;
  uint uStack_964;
  uint uStack_960;
  uint uStack_95c;
  uint local_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined8 local_858;
  float fStack_850;
  float fStack_84c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  pNVar41 = stack + 1;
  stack[0] = root;
  local_898 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_8a8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_8b8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_8c8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_8d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_8e8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_908 = local_8c8 * 0.99999964;
  fVar149 = local_8d8 * 0.99999964;
  local_8f8 = local_8e8 * 0.99999964;
  local_8c8 = local_8c8 * 1.0000004;
  local_8d8 = local_8d8 * 1.0000004;
  local_8e8 = local_8e8 * 1.0000004;
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar28 = (tray->tnear).field_0.i[k];
  auVar106._4_4_ = iVar28;
  auVar106._0_4_ = iVar28;
  auVar106._8_4_ = iVar28;
  auVar106._12_4_ = iVar28;
  iVar28 = (tray->tfar).field_0.i[k];
  auVar80._4_4_ = iVar28;
  auVar80._0_4_ = iVar28;
  auVar80._8_4_ = iVar28;
  auVar80._12_4_ = iVar28;
  local_c40 = (undefined1 (*) [12])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar47 = true;
  local_9e8 = fVar149;
  fStack_9e4 = fVar149;
  fStack_9e0 = fVar149;
  fStack_9dc = fVar149;
  local_9f8 = auVar106;
  local_a08 = auVar80;
  sVar38 = k;
  fStack_8c4 = local_8c8;
  fStack_8c0 = local_8c8;
  fStack_8bc = local_8c8;
  fStack_8e4 = local_8e8;
  fStack_8e0 = local_8e8;
  fStack_8dc = local_8e8;
  fStack_894 = local_898;
  fStack_890 = local_898;
  fStack_88c = local_898;
  fStack_8a4 = local_8a8;
  fStack_8a0 = local_8a8;
  fStack_89c = local_8a8;
  fVar49 = fVar149;
  fVar50 = fVar149;
  fVar169 = fVar149;
  fStack_8b4 = local_8b8;
  fStack_8b0 = local_8b8;
  fStack_8ac = local_8b8;
  fStack_8d4 = local_8d8;
  fStack_8d0 = local_8d8;
  fStack_8cc = local_8d8;
  fStack_8f4 = local_8f8;
  fStack_8f0 = local_8f8;
  fStack_8ec = local_8f8;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  do {
    uVar39 = pNVar41[-1].ptr;
    pNVar41 = pNVar41 + -1;
    while ((uVar39 & 8) == 0) {
      pfVar7 = (float *)(uVar39 + 0x20 + uVar43);
      auVar51._0_4_ = (*pfVar7 - local_898) * local_908;
      auVar51._4_4_ = (pfVar7[1] - fStack_894) * fStack_904;
      auVar51._8_4_ = (pfVar7[2] - fStack_890) * fStack_900;
      auVar51._12_4_ = (pfVar7[3] - fStack_88c) * fStack_8fc;
      pfVar7 = (float *)(uVar39 + 0x20 + uVar45);
      auVar104._0_4_ = (*pfVar7 - local_8a8) * fVar149;
      auVar104._4_4_ = (pfVar7[1] - fStack_8a4) * fVar49;
      auVar104._8_4_ = (pfVar7[2] - fStack_8a0) * fVar50;
      auVar104._12_4_ = (pfVar7[3] - fStack_89c) * fVar169;
      auVar51 = maxps(auVar51,auVar104);
      pfVar7 = (float *)(uVar39 + 0x20 + uVar46);
      auVar134._0_4_ = (*pfVar7 - local_8b8) * local_8f8;
      auVar134._4_4_ = (pfVar7[1] - fStack_8b4) * fStack_8f4;
      auVar134._8_4_ = (pfVar7[2] - fStack_8b0) * fStack_8f0;
      auVar134._12_4_ = (pfVar7[3] - fStack_8ac) * fStack_8ec;
      pfVar7 = (float *)(uVar39 + 0x20 + (uVar43 ^ 0x10));
      auVar103._0_4_ = (*pfVar7 - local_898) * local_8c8;
      auVar103._4_4_ = (pfVar7[1] - fStack_894) * fStack_8c4;
      auVar103._8_4_ = (pfVar7[2] - fStack_890) * fStack_8c0;
      auVar103._12_4_ = (pfVar7[3] - fStack_88c) * fStack_8bc;
      pfVar7 = (float *)(uVar39 + 0x20 + (uVar45 ^ 0x10));
      auVar116._0_4_ = (*pfVar7 - local_8a8) * local_8d8;
      auVar116._4_4_ = (pfVar7[1] - fStack_8a4) * fStack_8d4;
      auVar116._8_4_ = (pfVar7[2] - fStack_8a0) * fStack_8d0;
      auVar116._12_4_ = (pfVar7[3] - fStack_89c) * fStack_8cc;
      auVar104 = minps(auVar103,auVar116);
      pfVar7 = (float *)(uVar39 + 0x20 + (uVar46 ^ 0x10));
      auVar117._0_4_ = (*pfVar7 - local_8b8) * local_8e8;
      auVar117._4_4_ = (pfVar7[1] - fStack_8b4) * fStack_8e4;
      auVar117._8_4_ = (pfVar7[2] - fStack_8b0) * fStack_8e0;
      auVar117._12_4_ = (pfVar7[3] - fStack_8ac) * fStack_8dc;
      auVar78 = maxps(auVar134,auVar106);
      auVar51 = maxps(auVar51,auVar78);
      auVar78 = minps(auVar117,auVar80);
      auVar104 = minps(auVar104,auVar78);
      auVar78._4_4_ = -(uint)(auVar51._4_4_ <= auVar104._4_4_);
      auVar78._0_4_ = -(uint)(auVar51._0_4_ <= auVar104._0_4_);
      auVar78._8_4_ = -(uint)(auVar51._8_4_ <= auVar104._8_4_);
      auVar78._12_4_ = -(uint)(auVar51._12_4_ <= auVar104._12_4_);
      uVar34 = movmskps((int)sVar38,auVar78);
      sVar38 = (size_t)uVar34;
      if (uVar34 == 0) goto LAB_002aa3a9;
      sVar38 = (size_t)(byte)uVar34;
      uVar30 = uVar39 & 0xfffffffffffffff0;
      lVar14 = 0;
      if (sVar38 != 0) {
        for (; ((byte)uVar34 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar39 = *(ulong *)(uVar30 + lVar14 * 8);
      uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
      if (uVar34 != 0) {
        pNVar41->ptr = uVar39;
        pNVar41 = pNVar41 + 1;
        lVar14 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar39 = *(ulong *)(uVar30 + lVar14 * 8);
        uVar34 = uVar34 - 1 & uVar34;
        sVar38 = (size_t)uVar34;
        if (uVar34 != 0) {
          do {
            pNVar41->ptr = uVar39;
            pNVar41 = pNVar41 + 1;
            lVar14 = 0;
            if (sVar38 != 0) {
              for (; (sVar38 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            uVar39 = *(ulong *)(uVar30 + lVar14 * 8);
            sVar38 = sVar38 & sVar38 - 1;
          } while (sVar38 != 0);
        }
      }
    }
    uVar30 = (ulong)((uint)uVar39 & 0xf);
    if (uVar30 != 8) {
      uVar39 = uVar39 & 0xfffffffffffffff0;
      sVar38 = 0;
      do {
        lVar31 = sVar38 * 0x58;
        lVar14 = uVar39 + lVar31;
        uVar8 = *(undefined8 *)(uVar39 + 0x20 + lVar31);
        uVar9 = *(undefined8 *)(uVar39 + 0x24 + lVar31);
        bVar15 = (byte)uVar8;
        bVar48 = (byte)uVar9;
        bVar16 = (byte)((ulong)uVar8 >> 8);
        bVar69 = (byte)((ulong)uVar9 >> 8);
        bVar17 = (byte)((ulong)uVar8 >> 0x10);
        bVar70 = (byte)((ulong)uVar9 >> 0x10);
        bVar18 = (byte)((ulong)uVar8 >> 0x18);
        bVar71 = (byte)((ulong)uVar9 >> 0x18);
        bVar19 = (byte)((ulong)uVar8 >> 0x20);
        bVar72 = (byte)((ulong)uVar9 >> 0x20);
        bVar20 = (byte)((ulong)uVar8 >> 0x28);
        bVar73 = (byte)((ulong)uVar9 >> 0x28);
        bVar21 = (byte)((ulong)uVar8 >> 0x30);
        bVar74 = (byte)((ulong)uVar9 >> 0x30);
        bVar24 = (byte)((ulong)uVar9 >> 0x38);
        bVar22 = (byte)((ulong)uVar8 >> 0x38);
        auVar52[0] = -((byte)((bVar15 < bVar48) * bVar15 | (bVar15 >= bVar48) * bVar48) == bVar15);
        auVar52[1] = -((byte)((bVar16 < bVar69) * bVar16 | (bVar16 >= bVar69) * bVar69) == bVar16);
        auVar52[2] = -((byte)((bVar17 < bVar70) * bVar17 | (bVar17 >= bVar70) * bVar70) == bVar17);
        auVar52[3] = -((byte)((bVar18 < bVar71) * bVar18 | (bVar18 >= bVar71) * bVar71) == bVar18);
        auVar52[4] = -((byte)((bVar19 < bVar72) * bVar19 | (bVar19 >= bVar72) * bVar72) == bVar19);
        auVar52[5] = -((byte)((bVar20 < bVar73) * bVar20 | (bVar20 >= bVar73) * bVar73) == bVar20);
        auVar52[6] = -((byte)((bVar21 < bVar74) * bVar21 | (bVar21 >= bVar74) * bVar74) == bVar21);
        auVar52[7] = -((byte)((bVar22 < bVar24) * bVar22 | (bVar22 >= bVar24) * bVar24) == bVar22);
        auVar52[8] = 0xff;
        auVar52[9] = 0xff;
        auVar52[10] = 0xff;
        auVar52[0xb] = 0xff;
        auVar52[0xc] = 0xff;
        auVar52[0xd] = 0xff;
        auVar52[0xe] = 0xff;
        auVar52[0xf] = 0xff;
        fVar149 = *(float *)(uVar39 + 0x38 + lVar31);
        fVar49 = *(float *)(uVar39 + 0x3c + lVar31);
        fVar50 = *(float *)(uVar39 + 0x44 + lVar31);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)((uVar43 >> 2) + 0x20 + lVar14);
        auVar80 = pmovzxbd(auVar79,auVar79);
        auVar105._8_8_ = 0;
        auVar105._0_8_ = *(ulong *)(((uVar43 ^ 0x10) >> 2) + 0x20 + lVar14);
        auVar106 = pmovzxbd(auVar105,auVar105);
        fVar169 = *(float *)(uVar39 + 0x48 + lVar31);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = *(ulong *)((uVar45 >> 2) + 0x20 + lVar14);
        auVar51 = pmovzxbd(auVar118,auVar118);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = *(ulong *)(((uVar45 ^ 0x10) >> 2) + 0x20 + lVar14);
        auVar78 = pmovzxbd(auVar119,auVar119);
        fVar114 = *(float *)(uVar39 + 0x4c + lVar31);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = *(ulong *)((uVar46 >> 2) + 0x20 + lVar14);
        auVar104 = pmovzxbd(auVar126,auVar126);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = *(ulong *)(((uVar46 ^ 0x10) >> 2) + 0x20 + lVar14);
        auVar134 = pmovzxbd(auVar133,auVar133);
        fVar115 = *(float *)(uVar39 + 0x40 + lVar31);
        auVar81._0_4_ = (((float)auVar80._0_4_ * fVar50 + fVar149) - local_898) * local_908;
        auVar81._4_4_ = (((float)auVar80._4_4_ * fVar50 + fVar149) - fStack_894) * fStack_904;
        auVar81._8_4_ = (((float)auVar80._8_4_ * fVar50 + fVar149) - fStack_890) * fStack_900;
        auVar81._12_4_ = (((float)auVar80._12_4_ * fVar50 + fVar149) - fStack_88c) * fStack_8fc;
        auVar141._0_4_ = (((float)auVar51._0_4_ * fVar169 + fVar49) - local_8a8) * local_9e8;
        auVar141._4_4_ = (((float)auVar51._4_4_ * fVar169 + fVar49) - fStack_8a4) * fStack_9e4;
        auVar141._8_4_ = (((float)auVar51._8_4_ * fVar169 + fVar49) - fStack_8a0) * fStack_9e0;
        auVar141._12_4_ = (((float)auVar51._12_4_ * fVar169 + fVar49) - fStack_89c) * fStack_9dc;
        auVar80 = maxps(auVar81,auVar141);
        auVar107._0_4_ = (((float)auVar106._0_4_ * fVar50 + fVar149) - local_898) * local_8c8;
        auVar107._4_4_ = (((float)auVar106._4_4_ * fVar50 + fVar149) - fStack_894) * fStack_8c4;
        auVar107._8_4_ = (((float)auVar106._8_4_ * fVar50 + fVar149) - fStack_890) * fStack_8c0;
        auVar107._12_4_ = (((float)auVar106._12_4_ * fVar50 + fVar149) - fStack_88c) * fStack_8bc;
        auVar120._0_4_ = (((float)auVar78._0_4_ * fVar169 + fVar49) - local_8a8) * local_8d8;
        auVar120._4_4_ = (((float)auVar78._4_4_ * fVar169 + fVar49) - fStack_8a4) * fStack_8d4;
        auVar120._8_4_ = (((float)auVar78._8_4_ * fVar169 + fVar49) - fStack_8a0) * fStack_8d0;
        auVar120._12_4_ = (((float)auVar78._12_4_ * fVar169 + fVar49) - fStack_89c) * fStack_8cc;
        auVar106 = minps(auVar107,auVar120);
        auVar127._0_4_ = (((float)auVar104._0_4_ * fVar114 + fVar115) - local_8b8) * local_8f8;
        auVar127._4_4_ = (((float)auVar104._4_4_ * fVar114 + fVar115) - fStack_8b4) * fStack_8f4;
        auVar127._8_4_ = (((float)auVar104._8_4_ * fVar114 + fVar115) - fStack_8b0) * fStack_8f0;
        auVar127._12_4_ = (((float)auVar104._12_4_ * fVar114 + fVar115) - fStack_8ac) * fStack_8ec;
        auVar51 = maxps(auVar127,local_9f8);
        auVar80 = maxps(auVar80,auVar51);
        auVar135._0_4_ = (((float)auVar134._0_4_ * fVar114 + fVar115) - local_8b8) * local_8e8;
        auVar135._4_4_ = (((float)auVar134._4_4_ * fVar114 + fVar115) - fStack_8b4) * fStack_8e4;
        auVar135._8_4_ = (((float)auVar134._8_4_ * fVar114 + fVar115) - fStack_8b0) * fStack_8e0;
        auVar135._12_4_ = (((float)auVar134._12_4_ * fVar114 + fVar115) - fStack_8ac) * fStack_8dc;
        auVar51 = minps(auVar135,local_a08);
        auVar106 = minps(auVar106,auVar51);
        auVar53._4_4_ = -(uint)(auVar80._4_4_ <= auVar106._4_4_);
        auVar53._0_4_ = -(uint)(auVar80._0_4_ <= auVar106._0_4_);
        auVar53._8_4_ = -(uint)(auVar80._8_4_ <= auVar106._8_4_);
        auVar53._12_4_ = -(uint)(auVar80._12_4_ <= auVar106._12_4_);
        auVar80 = pmovzxbd(auVar52 ^ _DAT_01f7ae20,auVar52 ^ _DAT_01f7ae20);
        auVar53 = ~auVar80 & auVar53;
        auVar54._0_4_ = auVar53._0_4_ << 0x1f;
        auVar54._4_4_ = auVar53._4_4_ << 0x1f;
        auVar54._8_4_ = auVar53._8_4_ << 0x1f;
        auVar54._12_4_ = auVar53._12_4_ << 0x1f;
        uVar34 = movmskps((int)lVar31,auVar54);
        if (uVar34 != 0) {
          uVar37 = (ulong)(uVar34 & 0xff);
          do {
            lVar31 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            uVar10 = *(ushort *)(lVar14 + lVar31 * 8);
            uVar11 = *(ushort *)(lVar14 + 2 + lVar31 * 8);
            uStack_cb0._0_4_ = *(uint *)(lVar14 + 0x50);
            uVar34 = *(uint *)(lVar14 + 4 + lVar31 * 8);
            pGVar12 = (context->scene->geometries).items[(uint)uStack_cb0].ptr;
            local_c30 = *(long *)&pGVar12->field_0x58;
            lVar31 = *(long *)&pGVar12[1].time_range.upper;
            local_c38 = (ulong)uVar34 *
                        pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
            ;
            uVar44 = uVar10 & 0x7fff;
            uVar35 = *(uint *)(local_c30 + 4 + local_c38);
            uVar42 = (ulong)uVar35;
            uVar40 = (ulong)(uVar35 * (uVar11 & 0x7fff) + *(int *)(local_c30 + local_c38) + uVar44);
            p_Var13 = pGVar12[1].intersectionFilterN;
            pfVar7 = (float *)(lVar31 + (long)p_Var13 * uVar40);
            pfVar1 = (float *)(lVar31 + (uVar40 + 1) * (long)p_Var13);
            fVar149 = *pfVar1;
            local_928 = pfVar1[1];
            fVar49 = pfVar1[2];
            pfVar1 = (float *)(lVar31 + (uVar40 + uVar42) * (long)p_Var13);
            local_868 = *pfVar1;
            local_938 = pfVar1[1];
            local_918 = pfVar1[2];
            lVar36 = uVar40 + uVar42 + 1;
            pauVar2 = (undefined1 (*) [16])(lVar31 + lVar36 * (long)p_Var13);
            fStack_864 = *(float *)*pauVar2;
            fStack_934 = *(float *)(*pauVar2 + 4);
            fStack_914 = *(float *)(*pauVar2 + 8);
            auVar153 = *(undefined1 (*) [12])*pauVar2;
            auVar80 = *pauVar2;
            uVar32 = (ulong)(-1 < (short)uVar10);
            pfVar1 = (float *)(lVar31 + (uVar40 + uVar32 + 1) * (long)p_Var13);
            fVar50 = pfVar1[2];
            lVar33 = uVar32 + lVar36;
            uVar32 = 0;
            if (-1 < (short)uVar11) {
              uVar32 = uVar42;
            }
            pfVar3 = (float *)(lVar31 + lVar33 * (long)p_Var13);
            fStack_874 = pfVar3[1];
            fVar25 = pfVar3[2];
            pfVar4 = (float *)(lVar31 + (uVar40 + uVar42 + uVar32) * (long)p_Var13);
            pfVar5 = (float *)(lVar31 + (lVar36 + uVar32) * (long)p_Var13);
            local_888 = *pfVar5;
            fStack_884 = pfVar5[1];
            fStack_880 = pfVar5[2];
            local_878 = *pfVar3;
            fStack_870 = fVar25;
            fStack_86c = pfVar3[3];
            fStack_87c = pfVar5[3];
            fVar169 = *(float *)(ray + k * 4);
            local_a18 = *(float *)(ray + k * 4 + 0x10);
            fVar75 = *pfVar7 - fVar169;
            fVar94 = fVar149 - fVar169;
            fVar97 = fStack_864 - fVar169;
            fVar100 = local_868 - fVar169;
            local_858 = CONCAT44(*pfVar1,fVar149);
            fVar149 = fVar149 - fVar169;
            fVar122 = *pfVar1 - fVar169;
            fVar123 = *pfVar3 - fVar169;
            fVar124 = fStack_864 - fVar169;
            fStack_860 = local_888;
            fStack_85c = *pfVar4;
            fVar166 = local_868 - fVar169;
            fVar167 = fStack_864 - fVar169;
            fVar168 = local_888 - fVar169;
            fVar169 = *pfVar4 - fVar169;
            local_a28 = *(float *)(ray + k * 4 + 0x20);
            fVar181 = pfVar7[1] - local_a18;
            fVar186 = local_928 - local_a18;
            fVar189 = fStack_934 - local_a18;
            fVar192 = local_938 - local_a18;
            fVar159 = pfVar7[2] - local_a28;
            fVar163 = fVar49 - local_a28;
            fVar164 = fStack_914 - local_a28;
            fVar165 = local_918 - local_a28;
            fStack_930 = fStack_884;
            fStack_92c = pfVar4[1];
            local_c98 = local_938 - local_a18;
            fStack_c94 = fStack_934 - local_a18;
            fStack_c90 = fStack_884 - local_a18;
            fStack_c8c = pfVar4[1] - local_a18;
            fStack_910 = fStack_880;
            fStack_90c = pfVar4[2];
            local_cd8 = local_918 - local_a28;
            fStack_cd4 = fStack_914 - local_a28;
            fStack_cd0 = fStack_880 - local_a28;
            fStack_ccc = pfVar4[2] - local_a28;
            fVar140 = fVar166 - fVar75;
            fVar146 = fVar167 - fVar94;
            fVar147 = fVar168 - fVar97;
            fVar148 = fVar169 - fVar100;
            fVar76 = local_c98 - fVar181;
            fVar95 = fStack_c94 - fVar186;
            fVar98 = fStack_c90 - fVar189;
            fVar101 = fStack_c8c - fVar192;
            fVar155 = local_cd8 - fVar159;
            fVar156 = fStack_cd4 - fVar163;
            fVar157 = fStack_cd0 - fVar164;
            fVar158 = fStack_ccc - fVar165;
            fVar114 = *(float *)(ray + k * 4 + 0x50);
            fVar115 = *(float *)(ray + k * 4 + 0x60);
            fStack_ca4 = *(float *)(ray + k * 4 + 0x40);
            fVar125 = (fVar76 * (local_cd8 + fVar159) - (local_c98 + fVar181) * fVar155) *
                      fStack_ca4 +
                      ((fVar166 + fVar75) * fVar155 - (local_cd8 + fVar159) * fVar140) * fVar114 +
                      (fVar140 * (local_c98 + fVar181) - (fVar166 + fVar75) * fVar76) * fVar115;
            fVar132 = (fVar95 * (fStack_cd4 + fVar163) - (fStack_c94 + fVar186) * fVar156) *
                      fStack_ca4 +
                      ((fVar167 + fVar94) * fVar156 - (fStack_cd4 + fVar163) * fVar146) * fVar114 +
                      (fVar146 * (fStack_c94 + fVar186) - (fVar167 + fVar94) * fVar95) * fVar115;
            local_838._0_8_ = CONCAT44(fVar132,fVar125);
            local_838._8_4_ =
                 (fVar98 * (fStack_cd0 + fVar164) - (fStack_c90 + fVar189) * fVar157) * fStack_ca4 +
                 ((fVar168 + fVar97) * fVar157 - (fStack_cd0 + fVar164) * fVar147) * fVar114 +
                 (fVar147 * (fStack_c90 + fVar189) - (fVar168 + fVar97) * fVar98) * fVar115;
            local_838._12_4_ =
                 (fVar101 * (fStack_ccc + fVar165) - (fStack_c8c + fVar192) * fVar158) * fStack_ca4
                 + ((fVar169 + fVar100) * fVar158 - (fStack_ccc + fVar165) * fVar148) * fVar114 +
                   (fVar148 * (fStack_c8c + fVar192) - (fVar169 + fVar100) * fVar101) * fVar115;
            fStack_924 = pfVar1[1];
            fStack_920 = fStack_874;
            fStack_91c = fStack_934;
            fStack_a14 = local_a18;
            fStack_a10 = local_a18;
            fStack_a0c = local_a18;
            local_a68 = local_928 - local_a18;
            fStack_a64 = pfVar1[1] - local_a18;
            fStack_a60 = fStack_874 - local_a18;
            fStack_a5c = fStack_934 - local_a18;
            fStack_a24 = local_a28;
            fStack_a20 = local_a28;
            fStack_a1c = local_a28;
            local_a58 = fVar49 - local_a28;
            fStack_a54 = fVar50 - local_a28;
            fStack_a50 = fStack_be0 - local_a28;
            fStack_a4c = fStack_bdc - local_a28;
            local_7f8 = fVar75 - fVar149;
            fStack_7f4 = fVar94 - fVar122;
            fStack_7f0 = fVar97 - fVar123;
            fStack_7ec = fVar100 - fVar124;
            local_818 = fVar181 - local_a68;
            fStack_814 = fVar186 - fStack_a64;
            fStack_810 = fVar189 - fStack_a60;
            fStack_80c = fVar192 - fStack_a5c;
            fVar77 = fVar159 - local_a58;
            fVar96 = fVar163 - fStack_a54;
            fVar99 = fVar164 - fStack_a50;
            fVar102 = fVar165 - fStack_a4c;
            local_848._0_4_ =
                 (local_818 * (fVar159 + local_a58) - (fVar181 + local_a68) * fVar77) * fStack_ca4 +
                 ((fVar75 + fVar149) * fVar77 - (fVar159 + local_a58) * local_7f8) * fVar114 +
                 (local_7f8 * (fVar181 + local_a68) - (fVar75 + fVar149) * local_818) * fVar115;
            local_848._4_4_ =
                 (fStack_814 * (fVar163 + fStack_a54) - (fVar186 + fStack_a64) * fVar96) *
                 fStack_ca4 +
                 ((fVar94 + fVar122) * fVar96 - (fVar163 + fStack_a54) * fStack_7f4) * fVar114 +
                 (fStack_7f4 * (fVar186 + fStack_a64) - (fVar94 + fVar122) * fStack_814) * fVar115;
            local_848._8_4_ =
                 (fStack_810 * (fVar164 + fStack_a50) - (fVar189 + fStack_a60) * fVar99) *
                 fStack_ca4 +
                 ((fVar97 + fVar123) * fVar99 - (fVar164 + fStack_a50) * fStack_7f0) * fVar114 +
                 (fStack_7f0 * (fVar189 + fStack_a60) - (fVar97 + fVar123) * fStack_810) * fVar115;
            local_848._12_4_ =
                 (fStack_80c * (fVar165 + fStack_a4c) - (fVar192 + fStack_a5c) * fVar102) *
                 fStack_ca4 +
                 ((fVar100 + fVar124) * fVar102 - (fVar165 + fStack_a4c) * fStack_7ec) * fVar114 +
                 (fStack_7ec * (fVar192 + fStack_a5c) - (fVar100 + fVar124) * fStack_80c) * fVar115;
            fVar182 = fVar149 - fVar166;
            fVar187 = fVar122 - fVar167;
            fVar190 = fVar123 - fVar168;
            fVar193 = fVar124 - fVar169;
            local_7e8 = local_a68 - local_c98;
            fStack_7e4 = fStack_a64 - fStack_c94;
            fStack_7e0 = fStack_a60 - fStack_c90;
            fStack_7dc = fStack_a5c - fStack_c8c;
            local_808 = local_a58 - local_cd8;
            fStack_804 = fStack_a54 - fStack_cd4;
            fStack_800 = fStack_a50 - fStack_cd0;
            fStack_7fc = fStack_a4c - fStack_ccc;
            local_a48 = local_a68 + local_c98;
            fStack_a44 = fStack_a64 + fStack_c94;
            fStack_a40 = fStack_a60 + fStack_c90;
            fStack_a3c = fStack_a5c + fStack_c8c;
            local_a38 = local_a58 + local_cd8;
            fStack_a34 = fStack_a54 + fStack_cd4;
            fStack_a30 = fStack_a50 + fStack_cd0;
            fStack_a2c = fStack_a4c + fStack_ccc;
            auVar82._0_4_ =
                 (local_7e8 * local_a38 - local_a48 * local_808) * fStack_ca4 +
                 ((fVar166 + fVar149) * local_808 - fVar182 * local_a38) * fVar114 +
                 (fVar182 * local_a48 - (fVar166 + fVar149) * local_7e8) * fVar115;
            auVar82._4_4_ =
                 (fStack_7e4 * fStack_a34 - fStack_a44 * fStack_804) * fStack_ca4 +
                 ((fVar167 + fVar122) * fStack_804 - fVar187 * fStack_a34) * fVar114 +
                 (fVar187 * fStack_a44 - (fVar167 + fVar122) * fStack_7e4) * fVar115;
            auVar82._8_4_ =
                 (fStack_7e0 * fStack_a30 - fStack_a40 * fStack_800) * fStack_ca4 +
                 ((fVar168 + fVar123) * fStack_800 - fVar190 * fStack_a30) * fVar114 +
                 (fVar190 * fStack_a40 - (fVar168 + fVar123) * fStack_7e0) * fVar115;
            auVar82._12_4_ =
                 (fStack_7dc * fStack_a2c - fStack_a3c * fStack_7fc) * fStack_ca4 +
                 ((fVar169 + fVar124) * fStack_7fc - fVar193 * fStack_a2c) * fVar114 +
                 (fVar193 * fStack_a3c - (fVar169 + fVar124) * fStack_7dc) * fVar115;
            local_828 = fVar125 + local_848._0_4_ + auVar82._0_4_;
            fStack_824 = fVar132 + local_848._4_4_ + auVar82._4_4_;
            fStack_820 = local_838._8_4_ + local_848._8_4_ + auVar82._8_4_;
            fStack_81c = local_838._12_4_ + local_848._12_4_ + auVar82._12_4_;
            auVar55._8_4_ = local_838._8_4_;
            auVar55._0_8_ = local_838._0_8_;
            auVar55._12_4_ = local_838._12_4_;
            auVar106 = minps(auVar55,local_848);
            auVar106 = minps(auVar106,auVar82);
            auVar136._8_4_ = local_838._8_4_;
            auVar136._0_8_ = local_838._0_8_;
            auVar136._12_4_ = local_838._12_4_;
            auVar51 = maxps(auVar136,local_848);
            auVar51 = maxps(auVar51,auVar82);
            fVar149 = ABS(local_828);
            fVar169 = ABS(fStack_824);
            fVar122 = ABS(fStack_820);
            fVar123 = ABS(fStack_81c);
            auVar137._4_4_ = -(uint)(auVar51._4_4_ <= fVar169 * 1.1920929e-07);
            auVar137._0_4_ = -(uint)(auVar51._0_4_ <= fVar149 * 1.1920929e-07);
            auVar137._8_4_ = -(uint)(auVar51._8_4_ <= fVar122 * 1.1920929e-07);
            auVar137._12_4_ = -(uint)(auVar51._12_4_ <= fVar123 * 1.1920929e-07);
            auVar56._4_4_ = -(uint)(-(fVar169 * 1.1920929e-07) <= auVar106._4_4_);
            auVar56._0_4_ = -(uint)(-(fVar149 * 1.1920929e-07) <= auVar106._0_4_);
            auVar56._8_4_ = -(uint)(-(fVar122 * 1.1920929e-07) <= auVar106._8_4_);
            auVar56._12_4_ = -(uint)(-(fVar123 * 1.1920929e-07) <= auVar106._12_4_);
            auVar137 = auVar137 | auVar56;
            lVar33 = (uVar32 + lVar33) * (long)p_Var13;
            iVar28 = movmskps((int)lVar33,auVar137);
            puVar6 = (undefined8 *)(lVar31 + lVar33);
            local_c58 = *puVar6;
            uStack_c50 = puVar6[1];
            uVar29 = SUB84(ray,0);
            if (iVar28 != 0) {
              local_948 = fVar149;
              fStack_944 = fVar169;
              fStack_940 = fVar122;
              fStack_93c = fVar123;
              auVar177._0_4_ = local_818 * local_808 - local_7e8 * fVar77;
              auVar177._4_4_ = fStack_814 * fStack_804 - fStack_7e4 * fVar96;
              auVar177._8_4_ = fStack_810 * fStack_800 - fStack_7e0 * fVar99;
              auVar177._12_4_ = fStack_80c * fStack_7fc - fStack_7dc * fVar102;
              auVar57._4_4_ = -(uint)(ABS(fStack_814 * fVar156) < ABS(fStack_7e4 * fVar96));
              auVar57._0_4_ = -(uint)(ABS(local_818 * fVar155) < ABS(local_7e8 * fVar77));
              auVar57._8_4_ = -(uint)(ABS(fStack_810 * fVar157) < ABS(fStack_7e0 * fVar99));
              auVar57._12_4_ = -(uint)(ABS(fStack_80c * fVar158) < ABS(fStack_7dc * fVar102));
              auVar23._4_4_ = fVar95 * fVar96 - fStack_814 * fVar156;
              auVar23._0_4_ = fVar76 * fVar77 - local_818 * fVar155;
              auVar23._8_4_ = fVar98 * fVar99 - fStack_810 * fVar157;
              auVar23._12_4_ = fVar101 * fVar102 - fStack_80c * fVar158;
              local_a98 = blendvps(auVar177,auVar23,auVar57);
              auVar150._0_4_ = fVar155 * local_7f8 - fVar140 * fVar77;
              auVar150._4_4_ = fVar156 * fStack_7f4 - fVar146 * fVar96;
              auVar150._8_4_ = fVar157 * fStack_7f0 - fVar147 * fVar99;
              auVar150._12_4_ = fVar158 * fStack_7ec - fVar148 * fVar102;
              auVar184._0_4_ = fVar182 * fVar77 - local_7f8 * local_808;
              auVar184._4_4_ = fVar187 * fVar96 - fStack_7f4 * fStack_804;
              auVar184._8_4_ = fVar190 * fVar99 - fStack_7f0 * fStack_800;
              auVar184._12_4_ = fVar193 * fVar102 - fStack_7ec * fStack_7fc;
              auVar58._4_4_ = -(uint)(ABS(fVar146 * fVar96) < ABS(fStack_7f4 * fStack_804));
              auVar58._0_4_ = -(uint)(ABS(fVar140 * fVar77) < ABS(local_7f8 * local_808));
              auVar58._8_4_ = -(uint)(ABS(fVar147 * fVar99) < ABS(fStack_7f0 * fStack_800));
              auVar58._12_4_ = -(uint)(ABS(fVar148 * fVar102) < ABS(fStack_7ec * fStack_7fc));
              local_a88 = blendvps(auVar184,auVar150,auVar58);
              auVar160._0_4_ = fVar140 * local_818 - local_7f8 * fVar76;
              auVar160._4_4_ = fVar146 * fStack_814 - fStack_7f4 * fVar95;
              auVar160._8_4_ = fVar147 * fStack_810 - fStack_7f0 * fVar98;
              auVar160._12_4_ = fVar148 * fStack_80c - fStack_7ec * fVar101;
              auVar128._0_4_ = local_7f8 * local_7e8 - fVar182 * local_818;
              auVar128._4_4_ = fStack_7f4 * fStack_7e4 - fVar187 * fStack_814;
              auVar128._8_4_ = fStack_7f0 * fStack_7e0 - fVar190 * fStack_810;
              auVar128._12_4_ = fStack_7ec * fStack_7dc - fVar193 * fStack_80c;
              auVar59._4_4_ = -(uint)(ABS(fStack_7f4 * fVar95) < ABS(fVar187 * fStack_814));
              auVar59._0_4_ = -(uint)(ABS(local_7f8 * fVar76) < ABS(fVar182 * local_818));
              auVar59._8_4_ = -(uint)(ABS(fStack_7f0 * fVar98) < ABS(fVar190 * fStack_810));
              auVar59._12_4_ = -(uint)(ABS(fStack_7ec * fVar101) < ABS(fVar193 * fStack_80c));
              local_a78 = blendvps(auVar128,auVar160,auVar59);
              fVar76 = fStack_ca4 * local_a98._0_4_ +
                       fVar114 * local_a88._0_4_ + fVar115 * local_a78._0_4_;
              fVar77 = fStack_ca4 * local_a98._4_4_ +
                       fVar114 * local_a88._4_4_ + fVar115 * local_a78._4_4_;
              fVar95 = fStack_ca4 * local_a98._8_4_ +
                       fVar114 * local_a88._8_4_ + fVar115 * local_a78._8_4_;
              fVar96 = fStack_ca4 * local_a98._12_4_ +
                       fVar114 * local_a88._12_4_ + fVar115 * local_a78._12_4_;
              auVar60._0_4_ = fVar76 + fVar76;
              auVar60._4_4_ = fVar77 + fVar77;
              auVar60._8_4_ = fVar95 + fVar95;
              auVar60._12_4_ = fVar96 + fVar96;
              auVar108._0_4_ = fVar181 * local_a88._0_4_ + fVar159 * local_a78._0_4_;
              auVar108._4_4_ = fVar186 * local_a88._4_4_ + fVar163 * local_a78._4_4_;
              auVar108._8_4_ = fVar189 * local_a88._8_4_ + fVar164 * local_a78._8_4_;
              auVar108._12_4_ = fVar192 * local_a88._12_4_ + fVar165 * local_a78._12_4_;
              fVar95 = fVar75 * local_a98._0_4_ + auVar108._0_4_;
              fVar96 = fVar94 * local_a98._4_4_ + auVar108._4_4_;
              fVar97 = fVar97 * local_a98._8_4_ + auVar108._8_4_;
              fVar98 = fVar100 * local_a98._12_4_ + auVar108._12_4_;
              auVar106 = rcpps(auVar108,auVar60);
              fVar75 = auVar106._0_4_;
              fVar76 = auVar106._4_4_;
              fVar77 = auVar106._8_4_;
              fVar94 = auVar106._12_4_;
              local_aa8._0_4_ =
                   ((1.0 - auVar60._0_4_ * fVar75) * fVar75 + fVar75) * (fVar95 + fVar95);
              local_aa8._4_4_ =
                   ((1.0 - auVar60._4_4_ * fVar76) * fVar76 + fVar76) * (fVar96 + fVar96);
              local_aa8._8_4_ =
                   ((1.0 - auVar60._8_4_ * fVar77) * fVar77 + fVar77) * (fVar97 + fVar97);
              local_aa8._12_4_ =
                   ((1.0 - auVar60._12_4_ * fVar94) * fVar94 + fVar94) * (fVar98 + fVar98);
              fVar75 = *(float *)(ray + k * 4 + 0x80);
              fVar76 = *(float *)(ray + k * 4 + 0x30);
              auVar109._0_4_ =
                   -(uint)(local_aa8._0_4_ <= fVar75 && fVar76 <= local_aa8._0_4_) & auVar137._0_4_;
              auVar109._4_4_ =
                   -(uint)(local_aa8._4_4_ <= fVar75 && fVar76 <= local_aa8._4_4_) & auVar137._4_4_;
              auVar109._8_4_ =
                   -(uint)(local_aa8._8_4_ <= fVar75 && fVar76 <= local_aa8._8_4_) & auVar137._8_4_;
              auVar109._12_4_ =
                   -(uint)(local_aa8._12_4_ <= fVar75 && fVar76 <= local_aa8._12_4_) &
                   auVar137._12_4_;
              iVar28 = movmskps(uVar29,auVar109);
              if ((iVar28 != 0) &&
                 (auVar110._0_4_ = auVar109._0_4_ & -(uint)(auVar60._0_4_ != 0.0),
                 auVar110._4_4_ = auVar109._4_4_ & -(uint)(auVar60._4_4_ != 0.0),
                 auVar110._8_4_ = auVar109._8_4_ & -(uint)(auVar60._8_4_ != 0.0),
                 auVar110._12_4_ = auVar109._12_4_ & -(uint)(auVar60._12_4_ != 0.0),
                 uVar35 = movmskps((int)k,auVar110), uVar35 != 0)) {
                auVar26._4_4_ = fStack_824;
                auVar26._0_4_ = local_828;
                auVar26._8_4_ = fStack_820;
                auVar26._12_4_ = fStack_81c;
                auVar83._4_12_ = local_aa8._4_12_;
                auVar83._0_4_ = (float)(int)(*(ushort *)(local_c30 + 8 + local_c38) - 1);
                auVar129._4_4_ = local_aa8._4_4_;
                auVar129._0_4_ = auVar83._0_4_;
                auVar129._8_4_ = local_aa8._8_4_;
                auVar129._12_4_ = local_aa8._12_4_;
                auVar106 = rcpss(auVar129,auVar83);
                auVar138._4_12_ = auVar137._4_12_;
                auVar138._0_4_ = (float)(int)(*(ushort *)(local_c30 + 10 + local_c38) - 1);
                fVar76 = (2.0 - auVar83._0_4_ * auVar106._0_4_) * auVar106._0_4_;
                auVar130._4_4_ = auVar137._4_4_;
                auVar130._0_4_ = auVar138._0_4_;
                auVar130._8_4_ = auVar137._8_4_;
                auVar130._12_4_ = auVar137._12_4_;
                auVar106 = rcpss(auVar130,auVar138);
                fVar77 = (2.0 - auVar138._0_4_ * auVar106._0_4_) * auVar106._0_4_;
                auVar111._0_4_ = (float)(int)fVar25 * local_828 + local_848._0_4_;
                auVar111._4_4_ = (float)(int)fVar25 * fStack_824 + local_848._4_4_;
                auVar111._8_4_ = (float)((int)fVar25 + 1) * fStack_820 + local_848._8_4_;
                auVar111._12_4_ = (float)((int)fVar25 + 1) * fStack_81c + local_848._12_4_;
                pGVar12 = (context->scene->geometries).items[(uint)uStack_cb0].ptr;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002aa3bf;
                  auVar106 = rcpps(auVar111,auVar26);
                  fVar114 = auVar106._0_4_;
                  fVar115 = auVar106._4_4_;
                  fVar94 = auVar106._8_4_;
                  fVar95 = auVar106._12_4_;
                  fVar149 = (float)(-(uint)(1e-18 <= fVar149) &
                                   (uint)(((float)DAT_01f7ba10 - local_828 * fVar114) * fVar114 +
                                         fVar114));
                  fVar169 = (float)(-(uint)(1e-18 <= fVar169) &
                                   (uint)((DAT_01f7ba10._4_4_ - fStack_824 * fVar115) * fVar115 +
                                         fVar115));
                  fVar114 = (float)(-(uint)(1e-18 <= fVar122) &
                                   (uint)((DAT_01f7ba10._8_4_ - fStack_820 * fVar94) * fVar94 +
                                         fVar94));
                  fVar115 = (float)(-(uint)(1e-18 <= fVar123) &
                                   (uint)((DAT_01f7ba10._12_4_ - fStack_81c * fVar95) * fVar95 +
                                         fVar95));
                  auVar61._0_4_ = fVar76 * (fVar125 + (float)uVar44 * local_828) * fVar149;
                  auVar61._4_4_ = fVar76 * (fVar132 + (float)(uVar44 + 1) * fStack_824) * fVar169;
                  auVar61._8_4_ =
                       fVar76 * (local_838._8_4_ + (float)(uVar44 + 1) * fStack_820) * fVar114;
                  auVar61._12_4_ =
                       fVar76 * (local_838._12_4_ + (float)uVar44 * fStack_81c) * fVar115;
                  local_ac8 = minps(auVar61,_DAT_01f7ba10);
                  auVar84._0_4_ = fVar77 * auVar111._0_4_ * fVar149;
                  auVar84._4_4_ = fVar77 * auVar111._4_4_ * fVar169;
                  auVar84._8_4_ = fVar77 * auVar111._8_4_ * fVar114;
                  auVar84._12_4_ = fVar77 * auVar111._12_4_ * fVar115;
                  local_ab8 = minps(auVar84,_DAT_01f7ba10);
                  uVar40 = (ulong)(uVar35 & 0xff);
                  uVar32 = 0;
                  if (uVar40 != 0) {
                    for (; ((uVar35 & 0xff) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                    }
                  }
                  auVar27 = *local_c40;
                  fStack_ccc = (float)((ulong)*(undefined8 *)(*local_c40 + 8) >> 0x20);
                  do {
                    local_9a8 = *(undefined4 *)(local_ac8 + uVar32 * 4);
                    local_998._4_4_ = *(undefined4 *)(local_ab8 + uVar32 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_aa8 + uVar32 * 4);
                    args.context = context->user;
                    local_9d8 = *(undefined4 *)(local_a98 + uVar32 * 4);
                    local_9c8._4_4_ = *(undefined4 *)(local_a88 + uVar32 * 4);
                    local_9b8 = *(undefined4 *)(local_a78 + uVar32 * 4);
                    uStack_9d4 = local_9d8;
                    uStack_9d0 = local_9d8;
                    uStack_9cc = local_9d8;
                    local_9c8._0_4_ = local_9c8._4_4_;
                    local_9c8._8_4_ = local_9c8._4_4_;
                    local_9c8._12_4_ = local_9c8._4_4_;
                    uStack_9b4 = local_9b8;
                    uStack_9b0 = local_9b8;
                    uStack_9ac = local_9b8;
                    uStack_9a4 = local_9a8;
                    uStack_9a0 = local_9a8;
                    uStack_99c = local_9a8;
                    local_998._0_4_ = local_998._4_4_;
                    local_998._8_4_ = local_998._4_4_;
                    local_998._12_4_ = local_998._4_4_;
                    local_988 = CONCAT44(uVar34,uVar34);
                    uStack_980 = CONCAT44(uVar34,uVar34);
                    local_978 = CONCAT44((uint)uStack_cb0,(uint)uStack_cb0);
                    uStack_970 = CONCAT44((uint)uStack_cb0,(uint)uStack_cb0);
                    local_968 = (args.context)->instID[0];
                    uStack_964 = local_968;
                    uStack_960 = local_968;
                    uStack_95c = local_968;
                    local_958 = (args.context)->instPrimID[0];
                    uStack_954 = local_958;
                    uStack_950 = local_958;
                    uStack_94c = local_958;
                    local_c68._12_4_ = fStack_ccc;
                    local_c68._0_12_ = auVar27;
                    args.valid = (int *)local_c68;
                    args.geometryUserPtr = pGVar12->userPtr;
                    args.hit = (RTCHitN *)&local_9d8;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar12->occlusionFilterN)(&args);
                    }
                    if (local_c68 == (undefined1  [16])0x0) {
                      auVar85._8_4_ = 0xffffffff;
                      auVar85._0_8_ = 0xffffffffffffffff;
                      auVar85._12_4_ = 0xffffffff;
                      auVar85 = auVar85 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&args);
                      }
                      auVar62._0_4_ = -(uint)(local_c68._0_4_ == 0);
                      auVar62._4_4_ = -(uint)(local_c68._4_4_ == 0);
                      auVar62._8_4_ = -(uint)(local_c68._8_4_ == 0);
                      auVar62._12_4_ = -(uint)(local_c68._12_4_ == 0);
                      auVar85 = auVar62 ^ _DAT_01f7ae20;
                      auVar106 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                          auVar62);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar106;
                    }
                    auVar153 = auVar80._0_12_;
                    if ((_DAT_01f7bb20 & auVar85) != (undefined1  [16])0x0) goto LAB_002aa3bf;
                    *(float *)(ray + k * 4 + 0x80) = fVar75;
                    uVar40 = uVar40 ^ 1L << (uVar32 & 0x3f);
                    uVar32 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                  } while (uVar40 != 0);
                  local_a18 = *(float *)(ray + k * 4 + 0x10);
                  local_a28 = *(float *)(ray + k * 4 + 0x20);
                  fStack_ca4 = *(float *)(ray + k * 4 + 0x40);
                  fVar114 = *(float *)(ray + k * 4 + 0x50);
                  fVar115 = *(float *)(ray + k * 4 + 0x60);
                  local_c98 = local_938 - local_a18;
                  fStack_c94 = fStack_934 - local_a18;
                  fStack_c90 = fStack_930 - local_a18;
                  fStack_c8c = fStack_92c - local_a18;
                  local_cd8 = local_918 - local_a28;
                  fStack_cd4 = fStack_914 - local_a28;
                  fStack_cd0 = fStack_910 - local_a28;
                  fStack_ccc = fStack_90c - local_a28;
                  fStack_a14 = local_a18;
                  fStack_a10 = local_a18;
                  fStack_a0c = local_a18;
                  fStack_a24 = local_a28;
                  fStack_a20 = local_a28;
                  fStack_a1c = local_a28;
                  fStack_a54 = fVar50 - local_a28;
                  local_a48 = local_c98 + (local_928 - local_a18);
                  fStack_a44 = fStack_c94 + (fStack_924 - local_a18);
                  fStack_a40 = fStack_c90 + (fStack_920 - local_a18);
                  fStack_a3c = fStack_c8c + (fStack_91c - local_a18);
                  local_a38 = local_cd8 + (fVar49 - local_a28);
                  fStack_a34 = fStack_cd4 + fStack_a54;
                  fStack_a30 = fStack_cd0 + (fStack_be0 - local_a28);
                  fStack_a2c = fStack_ccc + (fStack_bdc - local_a28);
                  local_a58 = fVar49 - local_a28;
                  fStack_a50 = fStack_be0 - local_a28;
                  fStack_a4c = fStack_bdc - local_a28;
                  local_a68 = local_928 - local_a18;
                  fStack_a64 = fStack_924 - local_a18;
                  fStack_a60 = fStack_920 - local_a18;
                  fStack_a5c = fStack_91c - local_a18;
                }
              }
            }
            fVar163 = auVar153._8_4_ - fStack_a1c;
            fVar164 = fStack_870 - fStack_a1c;
            fVar165 = (float)uStack_c50 - fStack_a1c;
            fVar166 = fStack_880 - fStack_a1c;
            fVar186 = auVar153._4_4_ - fStack_a0c;
            fVar187 = fStack_874 - fStack_a0c;
            fVar189 = local_c58._4_4_ - fStack_a0c;
            fVar190 = fStack_884 - fStack_a0c;
            fVar149 = *(float *)(ray + k * 4);
            fVar167 = auVar153._0_4_ - fVar149;
            fVar168 = local_878 - fVar149;
            fVar181 = (float)local_c58 - fVar149;
            fVar182 = local_888 - fVar149;
            fVar172 = local_868 - fVar149;
            fVar173 = fStack_864 - fVar149;
            fVar174 = fStack_860 - fVar149;
            fVar175 = fStack_85c - fVar149;
            fVar76 = (float)local_858 - fVar149;
            fVar95 = local_858._4_4_ - fVar149;
            fVar98 = fStack_850 - fVar149;
            fVar149 = fStack_84c - fVar149;
            fVar99 = fVar76 - fVar167;
            fVar100 = fVar95 - fVar168;
            fVar101 = fVar98 - fVar181;
            fVar102 = fVar149 - fVar182;
            fVar158 = local_a68 - fVar186;
            fVar159 = fStack_a64 - fVar187;
            fStack_be0 = fStack_a60 - fVar189;
            fStack_bdc = fStack_a5c - fVar190;
            fVar132 = local_a58 - fVar163;
            fVar140 = fStack_a54 - fVar164;
            fVar146 = fStack_a50 - fVar165;
            fVar147 = fStack_a4c - fVar166;
            fVar49 = local_c98 - local_a68;
            fVar169 = fStack_c94 - fStack_a64;
            fVar77 = fStack_c90 - fStack_a60;
            fVar96 = fStack_c8c - fStack_a5c;
            fVar176 = local_cd8 - local_a58;
            fVar178 = fStack_cd4 - fStack_a54;
            fVar179 = fStack_cd0 - fStack_a50;
            fVar180 = fStack_ccc - fStack_a4c;
            fVar50 = fVar167 - fVar172;
            fVar75 = fVar168 - fVar173;
            fVar94 = fVar181 - fVar174;
            fVar97 = fVar182 - fVar175;
            fVar183 = (fVar158 * (local_a58 + fVar163) - (local_a68 + fVar186) * fVar132) *
                      fStack_ca4 +
                      ((fVar76 + fVar167) * fVar132 - (local_a58 + fVar163) * fVar99) * fVar114 +
                      (fVar99 * (local_a68 + fVar186) - (fVar76 + fVar167) * fVar158) * fVar115;
            fVar188 = (fVar159 * (fStack_a54 + fVar164) - (fStack_a64 + fVar187) * fVar140) *
                      fStack_ca4 +
                      ((fVar95 + fVar168) * fVar140 - (fStack_a54 + fVar164) * fVar100) * fVar114 +
                      (fVar100 * (fStack_a64 + fVar187) - (fVar95 + fVar168) * fVar159) * fVar115;
            fVar191 = (fStack_be0 * (fStack_a50 + fVar165) - (fStack_a60 + fVar189) * fVar146) *
                      fStack_ca4 +
                      ((fVar98 + fVar181) * fVar146 - (fStack_a50 + fVar165) * fVar101) * fVar114 +
                      (fVar101 * (fStack_a60 + fVar189) - (fVar98 + fVar181) * fStack_be0) * fVar115
            ;
            fVar194 = (fStack_bdc * (fStack_a4c + fVar166) - (fStack_a5c + fVar190) * fVar147) *
                      fStack_ca4 +
                      ((fVar149 + fVar182) * fVar147 - (fStack_a4c + fVar166) * fVar102) * fVar114 +
                      (fVar102 * (fStack_a5c + fVar190) - (fVar149 + fVar182) * fStack_bdc) *
                      fVar115;
            fVar122 = fVar186 - local_c98;
            fVar123 = fVar187 - fStack_c94;
            fVar124 = fVar189 - fStack_c90;
            fVar125 = fVar190 - fStack_c8c;
            fVar192 = fVar163 - local_cd8;
            fVar193 = fVar164 - fStack_cd4;
            fVar170 = fVar165 - fStack_cd0;
            fVar171 = fVar166 - fStack_ccc;
            local_c58 = CONCAT44(fVar168,fVar167);
            uStack_c50 = CONCAT44(fVar182,fVar181);
            auVar142._0_4_ =
                 (fVar122 * (local_cd8 + fVar163) - (local_c98 + fVar186) * fVar192) * fStack_ca4 +
                 ((fVar167 + fVar172) * fVar192 - (local_cd8 + fVar163) * fVar50) * fVar114 +
                 (fVar50 * (local_c98 + fVar186) - (fVar167 + fVar172) * fVar122) * fVar115;
            auVar142._4_4_ =
                 (fVar123 * (fStack_cd4 + fVar164) - (fStack_c94 + fVar187) * fVar193) * fStack_ca4
                 + ((fVar168 + fVar173) * fVar193 - (fStack_cd4 + fVar164) * fVar75) * fVar114 +
                   (fVar75 * (fStack_c94 + fVar187) - (fVar168 + fVar173) * fVar123) * fVar115;
            auVar142._8_4_ =
                 (fVar124 * (fStack_cd0 + fVar165) - (fStack_c90 + fVar189) * fVar170) * fStack_ca4
                 + ((fVar181 + fVar174) * fVar170 - (fStack_cd0 + fVar165) * fVar94) * fVar114 +
                   (fVar94 * (fStack_c90 + fVar189) - (fVar181 + fVar174) * fVar124) * fVar115;
            auVar142._12_4_ =
                 (fVar125 * (fStack_ccc + fVar166) - (fStack_c8c + fVar190) * fVar171) * fStack_ca4
                 + ((fVar182 + fVar175) * fVar171 - (fStack_ccc + fVar166) * fVar97) * fVar114 +
                   (fVar97 * (fStack_c8c + fVar190) - (fVar182 + fVar175) * fVar125) * fVar115;
            fVar148 = fVar172 - fVar76;
            fVar155 = fVar173 - fVar95;
            fVar156 = fVar174 - fVar98;
            fVar157 = fVar175 - fVar149;
            auVar63._0_4_ =
                 (fVar49 * local_a38 - local_a48 * fVar176) * fStack_ca4 +
                 ((fVar76 + fVar172) * fVar176 - local_a38 * fVar148) * fVar114 +
                 (fVar148 * local_a48 - (fVar76 + fVar172) * fVar49) * fVar115;
            auVar63._4_4_ =
                 (fVar169 * fStack_a34 - fStack_a44 * fVar178) * fStack_ca4 +
                 ((fVar95 + fVar173) * fVar178 - fStack_a34 * fVar155) * fVar114 +
                 (fVar155 * fStack_a44 - (fVar95 + fVar173) * fVar169) * fVar115;
            auVar63._8_4_ =
                 (fVar77 * fStack_a30 - fStack_a40 * fVar179) * fStack_ca4 +
                 ((fVar98 + fVar174) * fVar179 - fStack_a30 * fVar156) * fVar114 +
                 (fVar156 * fStack_a40 - (fVar98 + fVar174) * fVar77) * fVar115;
            auVar63._12_4_ =
                 (fVar96 * fStack_a2c - fStack_a3c * fVar180) * fStack_ca4 +
                 ((fVar149 + fVar175) * fVar180 - fStack_a2c * fVar157) * fVar114 +
                 (fVar157 * fStack_a3c - (fVar149 + fVar175) * fVar96) * fVar115;
            auVar112._0_4_ = fVar183 + auVar142._0_4_ + auVar63._0_4_;
            auVar112._4_4_ = fVar188 + auVar142._4_4_ + auVar63._4_4_;
            auVar112._8_4_ = fVar191 + auVar142._8_4_ + auVar63._8_4_;
            auVar112._12_4_ = fVar194 + auVar142._12_4_ + auVar63._12_4_;
            auVar86._8_4_ = fVar191;
            auVar86._0_8_ = CONCAT44(fVar188,fVar183);
            auVar86._12_4_ = fVar194;
            auVar80 = minps(auVar86,auVar142);
            auVar80 = minps(auVar80,auVar63);
            auVar161._8_4_ = fVar191;
            auVar161._0_8_ = CONCAT44(fVar188,fVar183);
            auVar161._12_4_ = fVar194;
            auVar106 = maxps(auVar161,auVar142);
            auVar106 = maxps(auVar106,auVar63);
            fVar149 = ABS(auVar112._0_4_) * 1.1920929e-07;
            fVar76 = ABS(auVar112._4_4_) * 1.1920929e-07;
            fVar95 = ABS(auVar112._8_4_) * 1.1920929e-07;
            fVar98 = ABS(auVar112._12_4_) * 1.1920929e-07;
            auVar162._4_4_ = -(uint)(auVar106._4_4_ <= fVar76);
            auVar162._0_4_ = -(uint)(auVar106._0_4_ <= fVar149);
            auVar162._8_4_ = -(uint)(auVar106._8_4_ <= fVar95);
            auVar162._12_4_ = -(uint)(auVar106._12_4_ <= fVar98);
            auVar87._4_4_ = -(uint)(-fVar76 <= auVar80._4_4_);
            auVar87._0_4_ = -(uint)(-fVar149 <= auVar80._0_4_);
            auVar87._8_4_ = -(uint)(-fVar95 <= auVar80._8_4_);
            auVar87._12_4_ = -(uint)(-fVar98 <= auVar80._12_4_);
            auVar162 = auVar162 | auVar87;
            iVar28 = movmskps(uVar29,auVar162);
            if (iVar28 != 0) {
              auVar143._0_4_ = fVar158 * fVar192 - fVar122 * fVar132;
              auVar143._4_4_ = fVar159 * fVar193 - fVar123 * fVar140;
              auVar143._8_4_ = fStack_be0 * fVar170 - fVar124 * fVar146;
              auVar143._12_4_ = fStack_bdc * fVar171 - fVar125 * fVar147;
              auVar121._0_4_ = fVar122 * fVar176 - fVar49 * fVar192;
              auVar121._4_4_ = fVar123 * fVar178 - fVar169 * fVar193;
              auVar121._8_4_ = fVar124 * fVar179 - fVar77 * fVar170;
              auVar121._12_4_ = fVar125 * fVar180 - fVar96 * fVar171;
              auVar64._4_4_ = -(uint)(ABS(fVar123 * fVar140) < ABS(fVar169 * fVar193));
              auVar64._0_4_ = -(uint)(ABS(fVar122 * fVar132) < ABS(fVar49 * fVar192));
              auVar64._8_4_ = -(uint)(ABS(fVar124 * fVar146) < ABS(fVar77 * fVar170));
              auVar64._12_4_ = -(uint)(ABS(fVar125 * fVar147) < ABS(fVar96 * fVar171));
              local_a98 = blendvps(auVar121,auVar143,auVar64);
              auVar151._0_4_ = fVar132 * fVar50 - fVar99 * fVar192;
              auVar151._4_4_ = fVar140 * fVar75 - fVar100 * fVar193;
              auVar151._8_4_ = fVar146 * fVar94 - fVar101 * fVar170;
              auVar151._12_4_ = fVar147 * fVar97 - fVar102 * fVar171;
              auVar139._0_4_ = fVar148 * fVar192 - fVar50 * fVar176;
              auVar139._4_4_ = fVar155 * fVar193 - fVar75 * fVar178;
              auVar139._8_4_ = fVar156 * fVar170 - fVar94 * fVar179;
              auVar139._12_4_ = fVar157 * fVar171 - fVar97 * fVar180;
              auVar65._4_4_ = -(uint)(ABS(fVar100 * fVar193) < ABS(fVar75 * fVar178));
              auVar65._0_4_ = -(uint)(ABS(fVar99 * fVar192) < ABS(fVar50 * fVar176));
              auVar65._8_4_ = -(uint)(ABS(fVar101 * fVar170) < ABS(fVar94 * fVar179));
              auVar65._12_4_ = -(uint)(ABS(fVar102 * fVar171) < ABS(fVar97 * fVar180));
              local_a88 = blendvps(auVar139,auVar151,auVar65);
              auVar185._0_4_ = fVar99 * fVar122 - fVar50 * fVar158;
              auVar185._4_4_ = fVar100 * fVar123 - fVar75 * fVar159;
              auVar185._8_4_ = fVar101 * fVar124 - fVar94 * fStack_be0;
              auVar185._12_4_ = fVar102 * fVar125 - fVar97 * fStack_bdc;
              auVar154._0_4_ = fVar50 * fVar49 - fVar148 * fVar122;
              auVar154._4_4_ = fVar75 * fVar169 - fVar155 * fVar123;
              auVar154._8_4_ = fVar94 * fVar77 - fVar156 * fVar124;
              auVar154._12_4_ = fVar97 * fVar96 - fVar157 * fVar125;
              auVar66._4_4_ = -(uint)(ABS(fVar75 * fVar159) < ABS(fVar155 * fVar123));
              auVar66._0_4_ = -(uint)(ABS(fVar50 * fVar158) < ABS(fVar148 * fVar122));
              auVar66._8_4_ = -(uint)(ABS(fVar94 * fStack_be0) < ABS(fVar156 * fVar124));
              auVar66._12_4_ = -(uint)(ABS(fVar97 * fStack_bdc) < ABS(fVar157 * fVar125));
              local_a78 = blendvps(auVar154,auVar185,auVar66);
              auVar88._0_4_ = fVar115 * local_a78._0_4_;
              auVar88._4_4_ = fVar115 * local_a78._4_4_;
              auVar88._8_4_ = fVar115 * local_a78._8_4_;
              auVar88._12_4_ = fVar115 * local_a78._12_4_;
              fVar149 = fStack_ca4 * local_a98._0_4_ + fVar114 * local_a88._0_4_ + auVar88._0_4_;
              fVar49 = fStack_ca4 * local_a98._4_4_ + fVar114 * local_a88._4_4_ + auVar88._4_4_;
              fVar50 = fStack_ca4 * local_a98._8_4_ + fVar114 * local_a88._8_4_ + auVar88._8_4_;
              fVar169 = fStack_ca4 * local_a98._12_4_ + fVar114 * local_a88._12_4_ + auVar88._12_4_;
              auVar131._0_4_ = fVar149 + fVar149;
              auVar131._4_4_ = fVar49 + fVar49;
              auVar131._8_4_ = fVar50 + fVar50;
              auVar131._12_4_ = fVar169 + fVar169;
              fVar114 = fVar167 * local_a98._0_4_ +
                        fVar186 * local_a88._0_4_ + fVar163 * local_a78._0_4_;
              fVar115 = fVar168 * local_a98._4_4_ +
                        fVar187 * local_a88._4_4_ + fVar164 * local_a78._4_4_;
              fVar75 = fVar181 * local_a98._8_4_ +
                       fVar189 * local_a88._8_4_ + fVar165 * local_a78._8_4_;
              fVar76 = fVar182 * local_a98._12_4_ +
                       fVar190 * local_a88._12_4_ + fVar166 * local_a78._12_4_;
              auVar80 = rcpps(auVar88,auVar131);
              fVar149 = auVar80._0_4_;
              fVar49 = auVar80._4_4_;
              fVar50 = auVar80._8_4_;
              fVar169 = auVar80._12_4_;
              local_aa8._0_4_ =
                   ((1.0 - auVar131._0_4_ * fVar149) * fVar149 + fVar149) * (fVar114 + fVar114);
              local_aa8._4_4_ =
                   ((1.0 - auVar131._4_4_ * fVar49) * fVar49 + fVar49) * (fVar115 + fVar115);
              local_aa8._8_4_ =
                   ((1.0 - auVar131._8_4_ * fVar50) * fVar50 + fVar50) * (fVar75 + fVar75);
              local_aa8._12_4_ =
                   ((1.0 - auVar131._12_4_ * fVar169) * fVar169 + fVar169) * (fVar76 + fVar76);
              fVar149 = *(float *)(ray + k * 4 + 0x80);
              fVar49 = *(float *)(ray + k * 4 + 0x30);
              auVar89._0_4_ =
                   -(uint)(local_aa8._0_4_ <= fVar149 && fVar49 <= local_aa8._0_4_) & auVar162._0_4_
              ;
              auVar89._4_4_ =
                   -(uint)(local_aa8._4_4_ <= fVar149 && fVar49 <= local_aa8._4_4_) & auVar162._4_4_
              ;
              auVar89._8_4_ =
                   -(uint)(local_aa8._8_4_ <= fVar149 && fVar49 <= local_aa8._8_4_) & auVar162._8_4_
              ;
              auVar89._12_4_ =
                   -(uint)(local_aa8._12_4_ <= fVar149 && fVar49 <= local_aa8._12_4_) &
                   auVar162._12_4_;
              iVar28 = movmskps(uVar29,auVar89);
              if (iVar28 != 0) {
                auVar90._0_4_ = auVar89._0_4_ & -(uint)(auVar131._0_4_ != 0.0);
                auVar90._4_4_ = auVar89._4_4_ & -(uint)(auVar131._4_4_ != 0.0);
                auVar90._8_4_ = auVar89._8_4_ & -(uint)(auVar131._8_4_ != 0.0);
                auVar90._12_4_ = auVar89._12_4_ & -(uint)(auVar131._12_4_ != 0.0);
                uVar35 = movmskps(iVar28,auVar90);
                if (uVar35 != 0) {
                  auVar113._0_4_ = auVar112._0_4_ - auVar142._0_4_;
                  auVar113._4_4_ = auVar112._4_4_ - auVar142._4_4_;
                  auVar113._8_4_ = auVar112._8_4_ - auVar142._8_4_;
                  auVar113._12_4_ = auVar112._12_4_ - auVar142._12_4_;
                  auVar91._4_12_ = auVar90._4_12_;
                  auVar91._0_4_ = (float)(int)(*(ushort *)(local_c30 + 8 + local_c38) - 1);
                  auVar144._4_4_ = auVar90._4_4_;
                  auVar144._0_4_ = auVar91._0_4_;
                  auVar144._8_4_ = auVar90._8_4_;
                  auVar144._12_4_ = auVar90._12_4_;
                  auVar80 = rcpss(auVar144,auVar91);
                  fVar49 = (2.0 - auVar91._0_4_ * auVar80._0_4_) * auVar80._0_4_;
                  auVar145._4_12_ = auVar80._4_12_;
                  auVar145._0_4_ = (float)(int)(*(ushort *)(local_c30 + 10 + local_c38) - 1);
                  auVar152._4_4_ = auVar80._4_4_;
                  auVar152._0_4_ = auVar145._0_4_;
                  auVar152._8_4_ = auVar80._8_4_;
                  auVar152._12_4_ = auVar80._12_4_;
                  auVar80 = rcpss(auVar152,auVar145);
                  fVar50 = (2.0 - auVar145._0_4_ * auVar80._0_4_) * auVar80._0_4_;
                  pGVar12 = (context->scene->geometries).items[(uint)uStack_cb0].ptr;
                  if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002aa3bf:
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      return bVar47;
                    }
                    auVar80 = rcpps(auVar113,auVar112);
                    fVar169 = auVar80._0_4_;
                    fVar114 = auVar80._4_4_;
                    fVar115 = auVar80._8_4_;
                    fVar75 = auVar80._12_4_;
                    fVar169 = (float)(-(uint)(1e-18 <= ABS(auVar112._0_4_)) &
                                     (uint)(((float)DAT_01f7ba10 - auVar112._0_4_ * fVar169) *
                                            fVar169 + fVar169));
                    fVar114 = (float)(-(uint)(1e-18 <= ABS(auVar112._4_4_)) &
                                     (uint)((DAT_01f7ba10._4_4_ - auVar112._4_4_ * fVar114) *
                                            fVar114 + fVar114));
                    fVar115 = (float)(-(uint)(1e-18 <= ABS(auVar112._8_4_)) &
                                     (uint)((DAT_01f7ba10._8_4_ - auVar112._8_4_ * fVar115) *
                                            fVar115 + fVar115));
                    fVar75 = (float)(-(uint)(1e-18 <= ABS(auVar112._12_4_)) &
                                    (uint)((DAT_01f7ba10._12_4_ - auVar112._12_4_ * fVar75) * fVar75
                                          + fVar75));
                    auVar67._0_4_ =
                         fVar49 * ((float)uVar44 * auVar112._0_4_ + (auVar112._0_4_ - fVar183)) *
                         fVar169;
                    auVar67._4_4_ =
                         fVar49 * ((float)(uVar44 + 1) * auVar112._4_4_ + (auVar112._4_4_ - fVar188)
                                  ) * fVar114;
                    auVar67._8_4_ =
                         fVar49 * ((float)(uVar44 + 1) * auVar112._8_4_ + (auVar112._8_4_ - fVar191)
                                  ) * fVar115;
                    auVar67._12_4_ =
                         fVar49 * ((float)uVar44 * auVar112._12_4_ + (auVar112._12_4_ - fVar194)) *
                         fVar75;
                    local_ac8 = minps(auVar67,_DAT_01f7ba10);
                    auVar92._0_4_ =
                         fVar50 * ((float)(int)fVar25 * auVar112._0_4_ + auVar113._0_4_) * fVar169;
                    auVar92._4_4_ =
                         fVar50 * ((float)(int)fVar25 * auVar112._4_4_ + auVar113._4_4_) * fVar114;
                    auVar92._8_4_ =
                         fVar50 * ((float)((int)fVar25 + 1) * auVar112._8_4_ + auVar113._8_4_) *
                         fVar115;
                    auVar92._12_4_ =
                         fVar50 * ((float)((int)fVar25 + 1) * auVar112._12_4_ + auVar113._12_4_) *
                         fVar75;
                    local_ab8 = minps(auVar92,_DAT_01f7ba10);
                    uVar40 = (ulong)(uVar35 & 0xff);
                    uVar32 = 0;
                    if (uVar40 != 0) {
                      for (; ((uVar35 & 0xff) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    _old_t = CONCAT44((uint)uStack_cb0,(uint)uStack_cb0);
                    uStack_cb0._4_4_ = (uint)uStack_cb0;
                    auVar153 = *local_c40;
                    uStack_c7c = (undefined4)((ulong)*(undefined8 *)(*local_c40 + 8) >> 0x20);
                    local_a28 = fStack_a1c;
                    fStack_a24 = fStack_a1c;
                    fStack_a20 = fStack_a1c;
                    local_a18 = fStack_a0c;
                    fStack_a14 = fStack_a0c;
                    fStack_a10 = fStack_a0c;
                    do {
                      local_9a8 = *(undefined4 *)(local_ac8 + uVar32 * 4);
                      uVar29 = *(undefined4 *)(local_ab8 + uVar32 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_aa8 + uVar32 * 4);
                      args.context = context->user;
                      local_998._4_4_ = uVar29;
                      local_998._0_4_ = uVar29;
                      local_998._8_4_ = uVar29;
                      local_998._12_4_ = uVar29;
                      local_9d8 = *(undefined4 *)(local_a98 + uVar32 * 4);
                      uVar29 = *(undefined4 *)(local_a88 + uVar32 * 4);
                      local_9b8 = *(undefined4 *)(local_a78 + uVar32 * 4);
                      local_9c8._4_4_ = uVar29;
                      local_9c8._0_4_ = uVar29;
                      local_9c8._8_4_ = uVar29;
                      local_9c8._12_4_ = uVar29;
                      uStack_9d4 = local_9d8;
                      uStack_9d0 = local_9d8;
                      uStack_9cc = local_9d8;
                      uStack_9b4 = local_9b8;
                      uStack_9b0 = local_9b8;
                      uStack_9ac = local_9b8;
                      uStack_9a4 = local_9a8;
                      uStack_9a0 = local_9a8;
                      uStack_99c = local_9a8;
                      local_988 = CONCAT44(uVar34,uVar34);
                      uStack_980 = CONCAT44(uVar34,uVar34);
                      local_978 = _old_t;
                      uStack_970 = uStack_cb0;
                      local_968 = (args.context)->instID[0];
                      uStack_964 = local_968;
                      uStack_960 = local_968;
                      uStack_95c = local_968;
                      local_958 = (args.context)->instPrimID[0];
                      uStack_954 = local_958;
                      uStack_950 = local_958;
                      uStack_94c = local_958;
                      local_c68._12_4_ = uStack_c7c;
                      local_c68._0_12_ = auVar153;
                      args.valid = (int *)local_c68;
                      args.geometryUserPtr = pGVar12->userPtr;
                      args.hit = (RTCHitN *)&local_9d8;
                      args.N = 4;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar12->occlusionFilterN)(&args);
                      }
                      if (local_c68 == (undefined1  [16])0x0) {
                        auVar93._8_4_ = 0xffffffff;
                        auVar93._0_8_ = 0xffffffffffffffff;
                        auVar93._12_4_ = 0xffffffff;
                        auVar93 = auVar93 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&args);
                        }
                        auVar68._0_4_ = -(uint)(local_c68._0_4_ == 0);
                        auVar68._4_4_ = -(uint)(local_c68._4_4_ == 0);
                        auVar68._8_4_ = -(uint)(local_c68._8_4_ == 0);
                        auVar68._12_4_ = -(uint)(local_c68._12_4_ == 0);
                        auVar93 = auVar68 ^ _DAT_01f7ae20;
                        auVar80 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),
                                           auVar68);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar80;
                      }
                      if ((_DAT_01f7bb20 & auVar93) != (undefined1  [16])0x0) goto LAB_002aa3bf;
                      *(float *)(ray + k * 4 + 0x80) = fVar149;
                      uVar40 = uVar40 ^ 1L << (uVar32 & 0x3f);
                      uVar32 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                        }
                      }
                    } while (uVar40 != 0);
                  }
                }
              }
            }
            uVar37 = uVar37 & uVar37 - 1;
          } while (uVar37 != 0);
        }
        sVar38 = sVar38 + 1;
        auVar80 = local_a08;
        auVar106 = local_9f8;
        fVar149 = local_9e8;
        fVar49 = fStack_9e4;
        fVar50 = fStack_9e0;
        fVar169 = fStack_9dc;
      } while (sVar38 != uVar30 - 8);
    }
LAB_002aa3a9:
    bVar47 = pNVar41 != stack;
    if (!bVar47) {
      return bVar47;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }